

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser * init_parse_act(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_act_name);
  parser_reg(p,"aim uint aim",parse_act_aim);
  parser_reg(p,"level int level",parse_act_level);
  parser_reg(p,"power uint power",parse_act_power);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_act_effect);
  parser_reg(p,"effect-yx int y int x",parse_act_effect_yx);
  parser_reg(p,"dice str dice",parse_act_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_act_expr);
  parser_reg(p,"msg str msg",parse_act_msg);
  parser_reg(p,"desc str desc",parse_act_desc);
  return p;
}

Assistant:

static struct parser *init_parse_act(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_act_name);
	parser_reg(p, "aim uint aim", parse_act_aim);
	parser_reg(p, "level int level", parse_act_level);
	parser_reg(p, "power uint power", parse_act_power);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_act_effect);
	parser_reg(p, "effect-yx int y int x", parse_act_effect_yx);
	parser_reg(p, "dice str dice", parse_act_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_act_expr);
	parser_reg(p, "msg str msg", parse_act_msg);
	parser_reg(p, "desc str desc", parse_act_desc);
	return p;
}